

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllEnumValues1
          (RustGenerator *this,EnumDef *enum_def,function<void_(const_flatbuffers::EnumVal_&)> *cb)

{
  int *piVar1;
  int iVar2;
  EnumVal *ev;
  pointer ppEVar3;
  allocator<char> local_89;
  CodeWriter *local_88;
  function<void_(const_flatbuffers::EnumVal_&)> *local_80;
  IdlNamer *local_78;
  string local_70;
  string local_50;
  
  local_88 = &this->code_;
  local_78 = &this->namer_;
  local_80 = cb;
  for (ppEVar3 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar3 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    ev = *ppEVar3;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"VARIANT",&local_89);
    (*(local_78->super_Namer)._vptr_Namer[0x13])(&local_70,local_78,ev);
    CodeWriter::SetValue(local_88,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"VALUE",&local_89);
    EnumDef::ToString_abi_cxx11_(&local_70,enum_def,ev);
    CodeWriter::SetValue(local_88,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::function<void_(const_flatbuffers::EnumVal_&)>::operator()(local_80,ev);
    iVar2 = (this->code_).cur_ident_lvl_;
    if (iVar2 != 0) {
      (this->code_).cur_ident_lvl_ = iVar2 + -1;
    }
  }
  return;
}

Assistant:

void ForAllEnumValues1(const EnumDef &enum_def,
                         std::function<void(const EnumVal &)> cb) {
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("VARIANT", namer_.Variant(ev));
      code_.SetValue("VALUE", enum_def.ToString(ev));
      code_.IncrementIdentLevel();
      cb(ev);
      code_.DecrementIdentLevel();
    }
  }